

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_3_2::jacobiSVD<float>
               (Matrix33<float> *A,Matrix33<float> *U,Vec3<float> *S,Matrix33<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  int i;
  uint uVar5;
  bool bVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float __tmp;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float r;
  float fVar28;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  float local_38;
  
  local_38 = A->x[0][0];
  local_48._0_4_ = A->x[0][1];
  fVar22 = A->x[0][2];
  local_48._4_4_ = A->x[1][0];
  fVar15 = A->x[1][1];
  fStack_54 = A->x[1][2];
  fVar16 = A->x[2][0];
  local_58 = A->x[2][1];
  fVar24 = A->x[2][2];
  *(float *)((long)(U->x + 0) + 0) = 1.0;
  *(float *)((long)(U->x + 0) + 4) = 0.0;
  *(undefined8 *)(U->x[0] + 2) = 0;
  *(float *)((long)(U->x + 1) + 4) = 1.0;
  *(float *)((long)(U->x + 1) + 8) = 0.0;
  *(float *)((long)(U->x + 2) + 0) = 0.0;
  *(float *)((long)(U->x + 2) + 4) = 0.0;
  U->x[2][2] = 1.0;
  *(float *)((long)(V->x + 0) + 0) = 1.0;
  *(float *)((long)(V->x + 0) + 4) = 0.0;
  *(undefined8 *)(V->x[0] + 2) = 0;
  *(float *)((long)(V->x + 1) + 4) = 1.0;
  *(float *)((long)(V->x + 1) + 8) = 0.0;
  *(float *)((long)(V->x + 2) + 0) = 0.0;
  *(float *)((long)(V->x + 2) + 4) = 0.0;
  V->x[2][2] = 1.0;
  fVar19 = ABS((float)local_48._0_4_);
  if (fVar19 <= 0.0) {
    fVar19 = 0.0;
  }
  fVar20 = ABS(fVar22);
  if (ABS(fVar22) <= fVar19) {
    fVar20 = fVar19;
  }
  fVar19 = ABS((float)local_48._4_4_);
  if (ABS((float)local_48._4_4_) <= fVar20) {
    fVar19 = fVar20;
  }
  fVar20 = ABS(fStack_54);
  if (ABS(fStack_54) <= fVar19) {
    fVar20 = fVar19;
  }
  fVar19 = ABS(fVar16);
  if (ABS(fVar16) <= fVar20) {
    fVar19 = fVar20;
  }
  fVar20 = ABS(local_58);
  if (ABS(local_58) <= fVar19) {
    fVar20 = fVar19;
  }
  fVar20 = fVar20 * tol;
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    fVar17 = 0.0;
    fVar18 = 0.0;
    uVar5 = 0;
    fVar19 = 0.0;
    fVar12 = 0.0;
    do {
      fStack_50 = 0.0;
      fStack_4c = 0.0;
      if (ABS((float)local_48._0_4_ - (float)local_48._4_4_) <= ABS(fVar15 + local_38) * tol) {
        fVar14 = fVar15 - local_38;
        fVar25 = (float)local_48._4_4_ + (float)local_48._0_4_;
        fVar28 = 0.0;
        fVar27 = 1.0;
        fVar12 = local_38;
        if (ABS(fVar14) * tol < ABS(fVar25)) goto LAB_00105147;
        bVar11 = false;
      }
      else {
        fVar27 = (fVar15 + local_38) / ((float)local_48._0_4_ - (float)local_48._4_4_);
        fVar25 = 1.0 / SQRT(fVar27 * fVar27 + 1.0);
        fVar28 = (float)((uint)-fVar25 & -(uint)(fVar27 < 0.0) |
                        ~-(uint)(fVar27 < 0.0) & (uint)fVar25);
        fVar27 = fVar27 * fVar28;
        fVar14 = ((float)local_48._4_4_ + (float)local_48._0_4_) * fVar28 +
                 (fVar15 - local_38) * fVar27;
        fVar25 = fVar27 * (float)local_48._0_4_ - fVar28 * fVar15;
        fVar25 = fVar25 + fVar25;
        fVar21 = 0.0;
        fVar26 = 1.0;
        fVar23 = 0.0;
        if (ABS(fVar14) * tol < ABS(fVar25)) {
LAB_00105147:
          fVar14 = fVar14 / fVar25;
          fVar25 = 1.0 / (SQRT(fVar14 * fVar14 + 1.0) + ABS(fVar14));
          fVar23 = (float)((uint)fVar12 & 0x80000000);
          fVar21 = (float)((uint)-fVar25 & -(uint)(fVar14 < 0.0) |
                          ~-(uint)(fVar14 < 0.0) & (uint)fVar25);
          fVar26 = 1.0 / SQRT(fVar21 * fVar21 + 1.0);
          fVar21 = fVar21 * fVar26;
        }
        fVar12 = -fVar15;
        fVar25 = fVar27 * fVar21 + fVar26 * fVar28;
        fVar14 = fVar27 * fVar26 + -fVar21 * fVar28;
        fVar28 = -fVar21 * local_58;
        fVar27 = -fVar25 * fStack_54;
        lVar7 = 0;
        do {
          fVar2 = *(float *)((long)U->x[0] + lVar7);
          fVar3 = *(float *)((long)U->x[0] + lVar7 + 4);
          *(ulong *)((long)U->x[0] + lVar7) =
               CONCAT44(fVar2 * fVar25 + fVar3 * fVar14,fVar2 * fVar14 + -fVar3 * fVar25);
          lVar7 = lVar7 + 0xc;
        } while (lVar7 != 0x24);
        lVar7 = 0;
        do {
          fVar2 = *(float *)((long)V->x[0] + lVar7);
          fVar3 = *(float *)((long)V->x[0] + lVar7 + 4);
          *(ulong *)((long)V->x[0] + lVar7) =
               CONCAT44(fVar2 * fVar21 + fVar3 * fVar26,fVar2 * fVar26 + -fVar3 * fVar21);
          lVar7 = lVar7 + 0xc;
        } while (lVar7 != 0x24);
        fVar15 = (local_38 * fVar21 + (float)local_48._0_4_ * fVar26) * fVar25 +
                 fVar14 * ((float)local_48._4_4_ * fVar21 + fVar15 * fVar26);
        local_38 = (local_38 * fVar26 + -(float)local_48._0_4_ * fVar21) * fVar14 +
                   -fVar25 * ((float)local_48._4_4_ * fVar26 + fVar12 * fVar21);
        local_58 = local_58 * fVar26 + fVar21 * fVar16;
        fStack_54 = fStack_54 * fVar14 + fVar25 * fVar22;
        fStack_50 = fVar23 * 0.0 + fVar26 * fVar17;
        fStack_4c = fVar14 * fVar18 + 0.0;
        bVar11 = true;
        fVar16 = fVar26 * fVar16 + fVar28;
        fVar22 = fVar14 * fVar22 + fVar27;
      }
      if (ABS(fVar22 - fVar16) <= ABS(local_38 + fVar24) * tol) {
        fVar18 = fVar24 - local_38;
        fVar17 = fVar16 + fVar22;
        fVar14 = 0.0;
        fVar25 = 1.0;
        fVar12 = 0.0;
        if (ABS(fVar18) * tol < ABS(fVar17)) goto LAB_00105416;
        _local_48 = ZEXT416(0);
        bVar6 = false;
      }
      else {
        fVar25 = (local_38 + fVar24) / (fVar22 - fVar16);
        fVar28 = 1.0;
        fVar19 = 1.0 / SQRT(fVar25 * fVar25 + 1.0);
        fVar26 = 0.0;
        fVar14 = (float)((uint)-fVar19 & -(uint)(fVar25 < 0.0) |
                        ~-(uint)(fVar25 < 0.0) & (uint)fVar19);
        fVar25 = fVar25 * fVar14;
        fVar18 = (fVar16 + fVar22) * fVar14 + (fVar24 - local_38) * fVar25;
        fVar17 = fVar25 * fVar22 - fVar14 * fVar24;
        fVar17 = fVar17 + fVar17;
        fVar19 = fVar22;
        fVar12 = local_38;
        fVar27 = 0.0;
        if (ABS(fVar18) * tol < ABS(fVar17)) {
LAB_00105416:
          fVar18 = fVar18 / fVar17;
          fVar17 = 1.0 / (SQRT(fVar18 * fVar18 + 1.0) + ABS(fVar18));
          fVar26 = (float)((uint)-fVar17 & -(uint)(fVar18 < 0.0) |
                          ~-(uint)(fVar18 < 0.0) & (uint)fVar17);
          fVar28 = 1.0 / SQRT(fVar26 * fVar26 + 1.0);
          fVar26 = fVar26 * fVar28;
          fVar27 = (float)((uint)fVar19 & 0x80000000);
        }
        fVar19 = fVar27;
        fVar17 = fVar26 * fVar25 + fVar14 * fVar28;
        fVar18 = fVar25 * fVar28 + -fVar26 * fVar14;
        lVar7 = 8;
        do {
          fVar25 = *(float *)((long)(U->x + -1) + 4 + lVar7);
          fVar14 = *(float *)((long)U->x[0] + lVar7);
          *(float *)((long)(U->x + -1) + 4 + lVar7) = fVar18 * fVar25 - fVar17 * fVar14;
          *(float *)((long)U->x[0] + lVar7) = fVar25 * fVar17 + fVar14 * fVar18;
          lVar7 = lVar7 + 0xc;
        } while (lVar7 != 0x2c);
        fVar25 = local_38 * fVar26;
        local_48._4_4_ = fVar28 * 0.0 + -fVar26 * fStack_54;
        local_48._0_4_ = fVar18 * 0.0 + -fVar17 * local_58;
        fStack_40 = fVar12 * 0.0 + -fVar19 * fStack_50;
        fStack_3c = -fVar19 * fStack_4c + 0.0;
        lVar7 = 8;
        do {
          fVar12 = *(float *)((long)(V->x + -1) + 4 + lVar7);
          fVar14 = *(float *)((long)V->x[0] + lVar7);
          *(float *)((long)(V->x + -1) + 4 + lVar7) = fVar28 * fVar12 - fVar26 * fVar14;
          *(float *)((long)V->x[0] + lVar7) = fVar12 * fVar26 + fVar14 * fVar28;
          lVar7 = lVar7 + 0xc;
        } while (lVar7 != 0x2c);
        local_38 = fVar18 * (local_38 * fVar28 + -fVar22 * fVar26) +
                   (fVar16 * fVar28 - fVar26 * fVar24) * -fVar17;
        fVar24 = fVar17 * (fVar25 + fVar22 * fVar28) + (fVar16 * fVar26 + fVar24 * fVar28) * fVar18;
        local_58 = local_58 * fVar18 + fVar17 * 0.0;
        fStack_54 = fStack_54 * fVar28 + fVar26 * 0.0;
        bVar6 = true;
      }
      if (ABS(fStack_54 - local_58) <= ABS(fVar15 + fVar24) * tol) {
        fVar22 = fVar24 - fVar15;
        fVar16 = local_58 + fStack_54;
        fVar12 = 0.0;
        fVar18 = 1.0;
        if (ABS(fVar22) * tol < ABS(fVar16)) goto LAB_00105744;
        fVar16 = 0.0;
        fVar22 = 0.0;
        fVar17 = 0.0;
        fVar18 = 0.0;
        if (!bVar11 && !bVar6) break;
      }
      else {
        fVar18 = (fVar15 + fVar24) / (fStack_54 - local_58);
        fVar22 = 1.0 / SQRT(fVar18 * fVar18 + 1.0);
        fVar12 = (float)((uint)-fVar22 & -(uint)(fVar18 < 0.0) |
                        ~-(uint)(fVar18 < 0.0) & (uint)fVar22);
        fVar18 = fVar18 * fVar12;
        fVar22 = (local_58 + fStack_54) * fVar12 + (fVar24 - fVar15) * fVar18;
        fVar16 = fVar18 * fStack_54 - fVar12 * fVar24;
        fVar16 = fVar16 + fVar16;
        fVar28 = 1.0;
        fVar25 = 0.0;
        fVar14 = 0.0;
        fVar19 = fStack_54;
        if (ABS(fVar22) * tol < ABS(fVar16)) {
LAB_00105744:
          fVar22 = fVar22 / fVar16;
          fVar16 = 1.0 / (SQRT(fVar22 * fVar22 + 1.0) + ABS(fVar22));
          fVar14 = (float)((uint)fVar19 & 0x80000000);
          fVar25 = (float)((uint)-fVar16 & -(uint)(fVar22 < 0.0) |
                          ~-(uint)(fVar22 < 0.0) & (uint)fVar16);
          fVar28 = 1.0 / SQRT(fVar25 * fVar25 + 1.0);
          fVar25 = fVar25 * fVar28;
        }
        fVar19 = fVar18 * fVar28 + -fVar25 * fVar12;
        fVar27 = fVar18 * fVar25 + fVar28 * fVar12;
        lVar7 = 0;
        do {
          fVar22 = *(float *)((long)U->x[0] + lVar7 + 4);
          fVar16 = *(float *)((long)U->x[0] + lVar7 + 8);
          *(ulong *)((long)U->x[0] + lVar7 + 4) =
               CONCAT44(fVar22 * fVar27 + fVar19 * fVar16,fVar22 * fVar19 + fVar27 * -fVar16);
          lVar7 = lVar7 + 0xc;
        } while (lVar7 != 0x24);
        fVar22 = fVar15 * fVar25;
        lVar7 = 0;
        do {
          fVar16 = *(float *)((long)V->x[0] + lVar7 + 4);
          fVar17 = *(float *)((long)V->x[0] + lVar7 + 8);
          *(ulong *)((long)V->x[0] + lVar7 + 4) =
               CONCAT44(fVar16 * fVar25 + fVar17 * fVar28,fVar16 * fVar28 + -fVar17 * fVar25);
          lVar7 = lVar7 + 0xc;
        } while (lVar7 != 0x24);
        fVar15 = (fVar15 * fVar28 + -fStack_54 * fVar25) * fVar19 +
                 -fVar27 * (local_58 * fVar28 + -fVar24 * fVar25);
        fVar24 = (fVar22 + fStack_54 * fVar28) * fVar27 +
                 fVar19 * (local_58 * fVar25 + fVar24 * fVar28);
        fVar16 = (float)local_48._4_4_ * fVar27 + fVar19 * 0.0;
        fVar22 = (float)local_48._0_4_ * fVar25 + fVar28 * 0.0;
        fVar17 = fStack_40 * (fVar18 * 0.0 + fVar12 * 0.0) + fVar27 * 0.0;
        fVar18 = fStack_3c * (fVar18 * fVar14 + fVar14 * fVar12) + fVar25 * 0.0;
        local_48._0_4_ = fVar28 * (float)local_48._0_4_ + fVar25 * -0.0;
        local_48._4_4_ = fVar19 * (float)local_48._4_4_ + fVar27 * -0.0;
        fStack_40 = fVar25 * fStack_40 + 0.0;
        fStack_3c = fVar27 * fStack_3c + fVar14 * 0.0;
      }
      auVar13._0_4_ = ABS((float)local_48._0_4_);
      auVar13._4_4_ = 0;
      auVar13._8_4_ = ABS(fStack_40);
      auVar13._12_4_ = ABS(fStack_3c);
      if (auVar13._0_4_ <= 0.0) {
        auVar4._12_4_ = 0;
        auVar4._0_12_ = auVar13._4_12_;
        auVar13 = auVar4 << 0x20;
      }
      fVar19 = ABS(fVar22);
      if (ABS(fVar22) <= auVar13._0_4_) {
        fVar19 = auVar13._0_4_;
      }
      fVar12 = ABS((float)local_48._4_4_);
      if (ABS((float)local_48._4_4_) <= fVar19) {
        fVar12 = fVar19;
      }
      fVar19 = ABS(fVar16);
      if (ABS(fVar16) <= fVar12) {
        fVar19 = fVar12;
      }
      if (fVar19 <= fVar20) break;
      local_58 = 0.0;
      fStack_54 = 0.0;
      bVar11 = uVar5 < 0x13;
      uVar5 = uVar5 + 1;
      fVar19 = fVar24;
      fVar12 = (float)local_48._4_4_;
    } while (bVar11);
  }
  S->x = local_38;
  S->y = fVar15;
  S->z = fVar24;
  lVar7 = 0;
  pfVar8 = (float *)U;
  do {
    if ((&S->x)[lVar7] < 0.0) {
      (&S->x)[lVar7] = -(&S->x)[lVar7];
      lVar9 = 0;
      do {
        *(uint *)((long)pfVar8 + lVar9) = *(uint *)((long)pfVar8 + lVar9) ^ 0x80000000;
        lVar9 = lVar9 + 0xc;
      } while (lVar9 != 0x24);
    }
    lVar7 = lVar7 + 1;
    pfVar8 = pfVar8 + 1;
  } while (lVar7 != 3);
  lVar7 = 2;
  bVar11 = true;
  do {
    bVar6 = bVar11;
    lVar9 = 0;
    pfVar8 = (float *)V;
    pfVar10 = (float *)U;
    do {
      fVar22 = (&S->x)[lVar9];
      lVar1 = lVar9 + 1;
      if (fVar22 < (&S->y)[lVar9]) {
        (&S->x)[lVar9] = (&S->y)[lVar9];
        (&S->y)[lVar9] = fVar22;
        lVar9 = 0;
        do {
          *(ulong *)((long)pfVar10 + lVar9) =
               CONCAT44((int)*(undefined8 *)((long)pfVar10 + lVar9),
                        (int)((ulong)*(undefined8 *)((long)pfVar10 + lVar9) >> 0x20));
          lVar9 = lVar9 + 0xc;
        } while (lVar9 != 0x24);
        lVar9 = 0;
        do {
          *(ulong *)((long)pfVar8 + lVar9) =
               CONCAT44((int)*(undefined8 *)((long)pfVar8 + lVar9),
                        (int)((ulong)*(undefined8 *)((long)pfVar8 + lVar9) >> 0x20));
          lVar9 = lVar9 + 0xc;
        } while (lVar9 != 0x24);
      }
      pfVar10 = pfVar10 + 1;
      pfVar8 = pfVar8 + 1;
      lVar9 = lVar1;
    } while (lVar1 != lVar7);
    lVar7 = lVar7 + -1;
    bVar11 = false;
  } while (bVar6);
  if (forcePositiveDeterminant) {
    fVar22 = U->x[1][0];
    fVar16 = U->x[1][1];
    fVar24 = U->x[2][2];
    fVar15 = U->x[1][2];
    fVar19 = U->x[2][1];
    fVar20 = U->x[2][0];
    if ((fVar22 * fVar19 - fVar20 * fVar16) * U->x[0][2] +
        (fVar16 * fVar24 - fVar19 * fVar15) * U->x[0][0] +
        (fVar15 * fVar20 - fVar24 * fVar22) * U->x[0][1] < 0.0) {
      lVar7 = 8;
      do {
        *(uint *)((long)U->x[0] + lVar7) = *(uint *)((long)U->x[0] + lVar7) ^ 0x80000000;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x2c);
      S->z = -S->z;
    }
    fVar22 = V->x[1][0];
    fVar16 = V->x[1][1];
    fVar24 = V->x[2][2];
    fVar15 = V->x[1][2];
    fVar19 = V->x[2][1];
    fVar20 = V->x[2][0];
    if ((fVar22 * fVar19 - fVar20 * fVar16) * V->x[0][2] +
        (fVar16 * fVar24 - fVar19 * fVar15) * V->x[0][0] +
        (fVar15 * fVar20 - fVar24 * fVar22) * V->x[0][1] < 0.0) {
      lVar7 = 8;
      do {
        *(uint *)((long)V->x[0] + lVar7) = *(uint *)((long)V->x[0] + lVar7) ^ 0x80000000;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x2c);
      S->z = -S->z;
    }
  }
  return;
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec3<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}